

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_progress_bar.cpp
# Opt level: O1

void __thiscall TestProgressBar::End(TestProgressBar *this)

{
  AssertionHandler catchAssertionHandler;
  StringRef local_90;
  AssertionHandler local_80;
  StringRef local_38;
  SourceLineInfo local_28;
  
  LOCK();
  (this->stop)._M_base._M_i = true;
  UNLOCK();
  std::thread::join();
  if ((this->error).callback.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*(this->error).callback._M_invoker)((_Any_data *)&this->error);
    local_90.m_start = "REQUIRE";
    local_90.m_size = 7;
    local_28.file =
         "/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/test/api/test_progress_bar.cpp"
    ;
    local_28.line = 0x57;
    Catch::StringRef::StringRef(&local_38,"false");
    Catch::AssertionHandler::AssertionHandler(&local_80,&local_90,&local_28,local_38,Normal);
    local_90.m_start = (char *)((ulong)local_90.m_start & 0xffffffffffffff00);
    Catch::AssertionHandler::handleExpr<bool>(&local_80,(ExprLhs<bool> *)&local_90);
    Catch::AssertionHandler::complete(&local_80);
    if (local_80.m_completed == false) {
      (*(local_80.m_resultCapture)->_vptr_IResultCapture[0x11])();
    }
  }
  return;
}

Assistant:

void End() {
		stop = true;
		check_thread.join();
		if (error.IsSet()) {
			error.ThrowError();
			// This should never be reached, ThrowError() should contain a failing REQUIRE statement
			REQUIRE(false);
		}
	}